

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionRotation_SQUAD.cpp
# Opt level: O3

void __thiscall
chrono::ChFunctionRotation_SQUAD::ArchiveIN(ChFunctionRotation_SQUAD *this,ChArchiveIn *marchive)

{
  ChNameValue<std::vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>_>
  local_38;
  
  ChArchiveIn::VersionRead<chrono::ChFunctionRotation_SQUAD>(marchive);
  ChFunctionRotation::ArchiveIN(&this->super_ChFunctionRotation,marchive);
  local_38._value = &this->rotations;
  local_38._name = "rotations";
  local_38._flags = '\0';
  ChArchiveIn::in<chrono::ChQuaternion<double>>(marchive,&local_38);
  local_38._value =
       (vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_> *)
       &this->p;
  local_38._name = "p";
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x18))(marchive,&local_38);
  local_38._value =
       (vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_> *)
       &this->space_fx;
  local_38._name = "space_fx";
  local_38._flags = '\0';
  ChArchiveIn::in<chrono::ChFunction>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChFunction>_> *)&local_38);
  local_38._value =
       (vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_> *)
       &this->closed;
  local_38._name = "closed";
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_38);
  return;
}

Assistant:

void ChFunctionRotation_SQUAD::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChFunctionRotation_SQUAD>();
	// deserialize parent class
    ChFunctionRotation::ArchiveIN(marchive);
    // deserialize all member data:
    marchive >> CHNVP(rotations);
    ////marchive >> CHNVP(knots);  //**TODO MATRIX DESERIALIZATION
    marchive >> CHNVP(p);
	marchive >> CHNVP(space_fx);
	marchive >> CHNVP(closed);
}